

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test5::verifyXFBData
          (GPUShaderFP64Test5 *this,uchar *data_ptr,_test_case *test_case)

{
  bool bVar1;
  _variable_type _Var2;
  _variable_type _Var3;
  uint uVar4;
  uint uVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *this_00;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type type_04;
  _variable_type type_05;
  _variable_type type_06;
  float fVar8;
  double dVar9;
  char (*local_a30) [9];
  char (*local_980) [9];
  char (*local_8d0) [9];
  char (*local_840) [9];
  char *local_818;
  uint local_80c;
  string local_808;
  string local_7e8;
  MessageBuilder local_7c8;
  float local_644;
  double dStack_640;
  uint result_value_3;
  double expected_value_3;
  double ref_expected_value_3;
  _Setprecision local_628;
  _Setprecision local_624;
  string local_620;
  string local_600;
  MessageBuilder local_5e0;
  float local_45c;
  float local_458;
  float result_value_2;
  float expected_value_2;
  float ref_expected_value_2;
  _Setprecision local_448;
  _Setprecision local_444;
  string local_440;
  string local_420;
  MessageBuilder local_400;
  double local_280;
  double result_value_1;
  double expected_value_1;
  double ref_expected_value_1;
  int local_25c;
  string local_258;
  string local_238;
  MessageBuilder local_208;
  float local_84;
  double dStack_80;
  int result_value;
  double expected_value;
  double ref_expected_value;
  uint local_68;
  uint n_swizzled_component;
  uint n_result_component;
  uint n_base_value;
  uchar *traveller_ptr;
  uint swizzle_order [4];
  _swizzle_type local_40;
  bool local_39;
  _swizzle_type swizzle_operator;
  bool result;
  uint n_src_components;
  uint n_result_components;
  uint n_base_values;
  float epsilon;
  _variable_type base_src_type;
  _variable_type base_dst_type;
  _test_case *test_case_local;
  uchar *data_ptr_local;
  GPUShaderFP64Test5 *this_local;
  
  _Var2 = Utils::getBaseVariableType(test_case->dst_type);
  _Var3 = Utils::getBaseVariableType(test_case->src_type);
  uVar4 = Utils::getNumberOfComponentsForVariableType(test_case->dst_type);
  uVar5 = Utils::getNumberOfComponentsForVariableType(test_case->src_type);
  local_39 = true;
  local_40 = SWIZZLE_TYPE_NONE;
  memset(&traveller_ptr,0,0x10);
  _n_result_component = (double *)data_ptr;
  bVar1 = Utils::isMatrixVariableType(test_case->src_type);
  if (!bVar1) {
    local_40 = this->m_swizzle_matrix[uVar4 - 1][uVar5 - 1];
    getSwizzleTypeProperties(this,local_40,(string *)0x0,(uint *)0x0,(uint *)&traveller_ptr);
  }
  for (n_swizzled_component = 0; n_swizzled_component < 5;
      n_swizzled_component = n_swizzled_component + 1) {
    for (local_68 = 0; local_68 < uVar4; local_68 = local_68 + 1) {
      ref_expected_value._4_4_ = local_68;
      if (local_40 != SWIZZLE_TYPE_NONE) {
        ref_expected_value._4_4_ =
             (local_68 / uVar4) * local_68 + swizzle_order[(ulong)local_68 - 2];
      }
      switch(_Var2) {
      case VARIABLE_TYPE_BOOL:
      case VARIABLE_TYPE_INT:
        expected_value =
             (double)(this->m_base_values[n_swizzled_component] + (float)ref_expected_value._4_4_);
        local_84 = *(float *)_n_result_component;
        dStack_80 = expected_value;
        if ((_Var2 == VARIABLE_TYPE_BOOL) && ((expected_value != 0.0 || (NAN(expected_value))))) {
          dStack_80 = 1.0;
        }
        if (local_84 != (float)(int)dStack_80) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_208,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_208,
                              (char (*) [54])"Invalid boolean/integer value obtained when doing an "
                             );
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            local_840 = (char (*) [9])0x2aa5ecf;
          }
          else {
            local_840 = (char (*) [9])0x2aa33f6;
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_840);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_238,(Utils *)(ulong)test_case->src_type,type);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_238);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], component index: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&ref_expected_value + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"], value: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&expected_value);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_258,(Utils *)(ulong)test_case->dst_type,type_00);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_258);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], retrieved value: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_84);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"], expected value: [");
          local_25c = (int)dStack_80;
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_25c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"], shader used:\n");
          ref_expected_value_1 = (double)std::__cxx11::string::c_str();
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&ref_expected_value_1);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_238);
          tcu::MessageBuilder::~MessageBuilder(&local_208);
          local_39 = false;
        }
        _n_result_component = (double *)((long)_n_result_component + 4);
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized variable type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x2001);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      case VARIABLE_TYPE_DOUBLE:
        expected_value_1 =
             (double)this->m_base_values[n_swizzled_component] + (double)ref_expected_value._4_4_;
        local_280 = *_n_result_component;
        if (_Var3 == VARIABLE_TYPE_BOOL) {
          result_value_1 =
               (double)((ulong)((uint)(-(ulong)((double)(int)expected_value_1 != 0.0) >> 0x20) &
                               0x3ff00000) << 0x20);
        }
        else if (_Var3 == VARIABLE_TYPE_INT) {
          result_value_1 = (double)(int)expected_value_1;
        }
        else {
          result_value_1 = expected_value_1;
          if (_Var3 == VARIABLE_TYPE_UINT) {
            if (expected_value_1 < 0.0) {
              result_value_1 =
                   (double)((int)(long)this->m_base_values[n_swizzled_component] +
                           ref_expected_value._4_4_);
            }
            result_value_1 = (double)((long)result_value_1 & 0xffffffff);
          }
        }
        _n_result_component = _n_result_component + 1;
        dVar9 = de::abs<double>(local_280 - result_value_1);
        if (9.999999747378752e-06 < dVar9) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_400,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_400,
                              (char (*) [70])
                              "Invalid double-precision floating-point value obtained when doing an "
                             );
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            local_8d0 = (char (*) [9])0x2aa5ecf;
          }
          else {
            local_8d0 = (char (*) [9])0x2aa33f6;
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_8d0);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_420,(Utils *)(ulong)test_case->src_type,type_01);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_420);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], component index: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&ref_expected_value + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"], value: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&expected_value_1);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_440,(Utils *)(ulong)test_case->dst_type,type_02);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_440);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], retrieved value: [");
          local_444 = std::setprecision(0x10);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_444);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_280);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"], expected value: [");
          local_448 = std::setprecision(0x10);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_448);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&result_value_1);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"], shader used:\n");
          _expected_value_2 = (char *)std::__cxx11::string::c_str();
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&expected_value_2);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_420);
          tcu::MessageBuilder::~MessageBuilder(&local_400);
          local_39 = false;
        }
        break;
      case VARIABLE_TYPE_FLOAT:
        result_value_2 = this->m_base_values[n_swizzled_component] + (float)ref_expected_value._4_4_
        ;
        local_45c = *(float *)_n_result_component;
        if (_Var3 == VARIABLE_TYPE_BOOL) {
          local_458 = (float)(-(uint)(result_value_2 != 0.0) & 0x3f800000);
        }
        else if (_Var3 == VARIABLE_TYPE_INT) {
          local_458 = (float)(int)result_value_2;
        }
        else {
          local_458 = result_value_2;
          if (_Var3 == VARIABLE_TYPE_UINT) {
            local_458 = (float)((long)result_value_2 & 0xffffffff);
          }
        }
        _n_result_component = (double *)((long)_n_result_component + 4);
        fVar8 = de::abs<float>(local_45c - local_458);
        if (1e-05 < fVar8) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_5e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_5e0,
                              (char (*) [70])
                              "Invalid single-precision floating-point value obtained when doing an "
                             );
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            local_980 = (char (*) [9])0x2aa5ecf;
          }
          else {
            local_980 = (char (*) [9])0x2aa33f6;
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_980);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_600,(Utils *)(ulong)test_case->src_type,type_03);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_600);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], component index: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&ref_expected_value + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"], value: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&result_value_2);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_620,(Utils *)(ulong)test_case->dst_type,type_04);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_620);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], retrieved value: [");
          local_624 = std::setprecision(0x10);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_624);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_45c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"], expected value: [");
          local_628 = std::setprecision(0x10);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_628);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_458);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"], shader used:\n");
          ref_expected_value_3 = (double)std::__cxx11::string::c_str();
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&ref_expected_value_3);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_620);
          std::__cxx11::string::~string((string *)&local_600);
          tcu::MessageBuilder::~MessageBuilder(&local_5e0);
          local_39 = false;
        }
        break;
      case VARIABLE_TYPE_UINT:
        fVar8 = this->m_base_values[n_swizzled_component] + (float)ref_expected_value._4_4_;
        dStack_640 = (double)fVar8;
        local_644 = *(float *)_n_result_component;
        _n_result_component = (double *)((long)_n_result_component + 4);
        expected_value_3 = dStack_640;
        if ((local_644 != (float)(long)fVar8) && (0.0 <= dStack_640)) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_7c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_7c8,
                              (char (*) [55])
                              "Invalid unsigned integer value obtained when doing an ");
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            local_a30 = (char (*) [9])0x2aa5ecf;
          }
          else {
            local_a30 = (char (*) [9])0x2aa33f6;
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_a30);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" cast from GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_7e8,(Utils *)(ulong)test_case->src_type,type_05);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_7e8);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], component index: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&ref_expected_value + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"], value: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&expected_value_3);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] to GLSL type [");
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_808,(Utils *)(ulong)test_case->dst_type,type_06);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_808);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])"], retrieved value: [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&local_644);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"], expected value: [");
          local_80c = (uint)(long)dStack_640;
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_80c);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"], shader used:\n");
          local_818 = (char *)std::__cxx11::string::c_str();
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_818);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_808);
          std::__cxx11::string::~string((string *)&local_7e8);
          tcu::MessageBuilder::~MessageBuilder(&local_7c8);
          local_39 = false;
        }
      }
    }
  }
  return local_39;
}

Assistant:

bool GPUShaderFP64Test5::verifyXFBData(const unsigned char* data_ptr, const _test_case& test_case)
{
	const Utils::_variable_type base_dst_type		= Utils::getBaseVariableType(test_case.dst_type);
	const Utils::_variable_type base_src_type		= Utils::getBaseVariableType(test_case.src_type);
	const float					epsilon				= 1e-5f;
	const unsigned int			n_base_values		= sizeof(m_base_values) / sizeof(m_base_values[0]);
	const unsigned int			n_result_components = Utils::getNumberOfComponentsForVariableType(test_case.dst_type);
	const unsigned int			n_src_components	= Utils::getNumberOfComponentsForVariableType(test_case.src_type);
	bool						result				= true;
	_swizzle_type				swizzle_operator	= SWIZZLE_TYPE_NONE;
	unsigned int				swizzle_order[4]	= { 0 };
	const unsigned char*		traveller_ptr		= data_ptr;

	if (!Utils::isMatrixVariableType(test_case.src_type))
	{
		DE_ASSERT(n_result_components >= 1 && n_result_components <= 4);
		DE_ASSERT(n_src_components >= 1 && n_src_components <= 4);

		swizzle_operator = m_swizzle_matrix[n_result_components - 1][n_src_components - 1];

		getSwizzleTypeProperties(swizzle_operator, DE_NULL, /* out_swizzle_string */
								 DE_NULL,					/* out_n_components */
								 swizzle_order);
	}

	for (unsigned int n_base_value = 0; n_base_value < n_base_values; ++n_base_value)
	{
		for (unsigned int n_result_component = 0; n_result_component < n_result_components; ++n_result_component)
		{
			unsigned int n_swizzled_component = n_result_component;

			if (swizzle_operator != SWIZZLE_TYPE_NONE)
			{
				n_swizzled_component =
					(n_result_component / n_result_components) * n_result_component + swizzle_order[n_result_component];
			}

			switch (base_dst_type)
			{
			case Utils::VARIABLE_TYPE_BOOL:
			case Utils::VARIABLE_TYPE_INT:
			{
				double ref_expected_value = (m_base_values[n_base_value]) + static_cast<float>(n_swizzled_component);
				double expected_value	 = ref_expected_value;
				int	result_value		  = *((int*)traveller_ptr);

				if (base_dst_type == Utils::VARIABLE_TYPE_BOOL)
				{
					if (expected_value != 0.0)
					{
						expected_value = 1.0;
					}
				}

				if (result_value != (int)expected_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid boolean/integer value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << result_value << "]"
														  ", expected value: ["
									   << (int)expected_value << "]"
																 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				traveller_ptr += sizeof(int);
				break;
			} /* VARIABLE_TYPE_BOOL or VARIABLE_TYPE_INT cases */

			case Utils::VARIABLE_TYPE_DOUBLE:
			{
				double ref_expected_value = m_base_values[n_base_value] + (double)n_swizzled_component;
				double expected_value	 = ref_expected_value;
				double result_value		  = *((double*)traveller_ptr);

				if (base_src_type == Utils::VARIABLE_TYPE_BOOL)
				{
					expected_value = ((int)expected_value != 0.0) ? 1.0 : 0.0;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_INT)
				{
					expected_value = (int)expected_value;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_UINT)
				{
					// Negative values in base values array when converted to unsigned int will be ZERO
					// Addition operations done inside the shader in such cases will operate on ZERO rather
					// than the negative value being passed.
					// Replicate the sequence of conversion and addition operations done on the
					// shader input, to calculate the expected values in XFB data in the
					// problematic cases.
					if (expected_value < 0)
					{
						expected_value = (unsigned int)m_base_values[n_base_value] + n_swizzled_component;
					}
					expected_value = (unsigned int)expected_value;
				}

				traveller_ptr += sizeof(double);
				if (de::abs(result_value - expected_value) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid double-precision floating-point value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << std::setprecision(16) << result_value << "]"
																				   ", expected value: ["
									   << std::setprecision(16) << expected_value << "]"
																					 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_DOUBLE case */

			case Utils::VARIABLE_TYPE_FLOAT:
			{
				float ref_expected_value = (float)m_base_values[n_base_value] + (float)n_swizzled_component;
				float expected_value	 = ref_expected_value;
				float result_value		 = *((float*)traveller_ptr);

				if (base_src_type == Utils::VARIABLE_TYPE_BOOL)
				{
					expected_value = (expected_value != 0.0f) ? 1.0f : 0.0f;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_INT)
				{
					expected_value = (float)((int)expected_value);
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_UINT)
				{
					expected_value = (float)((unsigned int)expected_value);
				}

				traveller_ptr += sizeof(float);
				if (de::abs(result_value - expected_value) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid single-precision floating-point value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << std::setprecision(16) << result_value << "]"
																				   ", expected value: ["
									   << std::setprecision(16) << expected_value << "]"
																					 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_FLOAT case */

			case Utils::VARIABLE_TYPE_UINT:
			{
				double ref_expected_value = (m_base_values[n_base_value]) + static_cast<float>(n_swizzled_component);
				double expected_value	 = ref_expected_value;
				unsigned int result_value = *((unsigned int*)traveller_ptr);

				traveller_ptr += sizeof(unsigned int);
				if (result_value != (unsigned int)expected_value)
				{
					if (expected_value < 0.0)
					{
						// It is undefined to convert a negative floating-point value to an uint.
						break;
					}

					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid unsigned integer value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << result_value << "]"
														  ", expected value: ["
									   << (unsigned int)expected_value << "]"
																		  ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_UINT case */

			default:
			{
				TCU_FAIL("Unrecognized variable type");
			}
			} /* switch (test_case.dst_type) */
		}	 /* for (all result components) */
	}		  /* for (all base values) */

	return result;
}